

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O2

void __thiscall sqvector<char>::resize(sqvector<char> *this,SQUnsignedInteger newsize,char *fill)

{
  ulong uVar1;
  
  if (this->_allocated < newsize) {
    _realloc(this,newsize);
  }
  uVar1 = this->_size;
  if (uVar1 < newsize) {
    while (uVar1 < newsize) {
      this->_vals[uVar1] = *fill;
      uVar1 = this->_size + 1;
      this->_size = uVar1;
    }
  }
  else {
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }